

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_proof_deserialize
              (secp256k1_ge *rp,secp256k1_scalar *dleq_proof_s,secp256k1_scalar *dleq_proof_e,
              uchar *adaptor_proof97)

{
  int iVar1;
  int local_34;
  uchar *puStack_30;
  int overflow;
  uchar *adaptor_proof97_local;
  secp256k1_scalar *dleq_proof_e_local;
  secp256k1_scalar *dleq_proof_s_local;
  secp256k1_ge *rp_local;
  
  puStack_30 = adaptor_proof97;
  adaptor_proof97_local = (uchar *)dleq_proof_e;
  dleq_proof_e_local = dleq_proof_s;
  dleq_proof_s_local = (secp256k1_scalar *)rp;
  iVar1 = secp256k1_dleq_deserialize_point(rp,adaptor_proof97);
  if (iVar1 == 0) {
    rp_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32(dleq_proof_e_local,puStack_30 + 0x21,&local_34);
    if (local_34 == 0) {
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)adaptor_proof97_local,puStack_30 + 0x41,&local_34);
      if (local_34 == 0) {
        rp_local._4_4_ = 1;
      }
      else {
        rp_local._4_4_ = 0;
      }
    }
    else {
      rp_local._4_4_ = 0;
    }
  }
  return rp_local._4_4_;
}

Assistant:

static int secp256k1_ecdsa_adaptor_proof_deserialize(secp256k1_ge *rp, secp256k1_scalar *dleq_proof_s, secp256k1_scalar *dleq_proof_e, const unsigned char *adaptor_proof97) {
    int overflow;
    if (!secp256k1_dleq_deserialize_point(rp, &adaptor_proof97[0])) {
        return 0;
    }
    secp256k1_scalar_set_b32(dleq_proof_s, &adaptor_proof97[33], &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_scalar_set_b32(dleq_proof_e, &adaptor_proof97[33 + 32], &overflow);
    if (overflow) {
        return 0;
    }
    return 1;
}